

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

long __thiscall DeviceTy::getMapEntryRefCnt(DeviceTy *this,void *HstPtrBegin)

{
  bool bVar1;
  reference pHVar2;
  ulong in_RSI;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_RDI;
  HostDataToTargetTy *HT;
  iterator __end1;
  iterator __begin1;
  HostDataToTargetListTy *__range1;
  long RefCnt;
  uintptr_t hp;
  mutex *in_stack_ffffffffffffffc0;
  _Self local_38;
  _Self local_30;
  _List_node_base **local_28;
  long local_20;
  ulong local_18;
  
  local_20 = -1;
  local_18 = in_RSI;
  std::mutex::lock(in_stack_ffffffffffffffc0);
  local_28 = &in_RDI[1].super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>.
              _M_impl._M_node.super__List_node_base._M_prev;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::begin(in_RDI);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::end(in_RDI);
  do {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
LAB_00103793:
      std::mutex::unlock((mutex *)0x1037a3);
      return local_20;
    }
    pHVar2 = std::_List_iterator<HostDataToTargetTy>::operator*
                       ((_List_iterator<HostDataToTargetTy> *)0x103750);
    if ((pHVar2->HstPtrBegin <= local_18) && (local_18 < pHVar2->HstPtrEnd)) {
      local_20 = pHVar2->RefCount;
      goto LAB_00103793;
    }
    std::_List_iterator<HostDataToTargetTy>::operator++(&local_30);
  } while( true );
}

Assistant:

long DeviceTy::getMapEntryRefCnt(void *HstPtrBegin) {
  uintptr_t hp = (uintptr_t)HstPtrBegin;
  long RefCnt = -1;

  DataMapMtx.lock();
  for (auto &HT : HostDataToTargetMap) {
    if (hp >= HT.HstPtrBegin && hp < HT.HstPtrEnd) {
      DP("DeviceTy::getMapEntry: requested entry found\n");
      RefCnt = HT.RefCount;
      break;
    }
  }
  DataMapMtx.unlock();

  if (RefCnt < 0) {
    DP("DeviceTy::getMapEntry: requested entry not found\n");
  }

  return RefCnt;
}